

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_zip.c
# Opt level: O1

int TIFFInitZIP(TIFF *tif,int scheme)

{
  int iVar1;
  uint8_t *puVar2;
  char *fmt;
  
  if ((scheme != 8) && (scheme != 0x80b2)) {
    __assert_fail("(scheme == COMPRESSION_DEFLATE) || (scheme == COMPRESSION_ADOBE_DEFLATE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_zip.c"
                  ,0x296,"int TIFFInitZIP(TIFF *, int)");
  }
  iVar1 = _TIFFMergeFields(tif,zipFields,2);
  if (iVar1 == 0) {
    fmt = "Merging Deflate codec-specific tags failed";
  }
  else {
    puVar2 = (uint8_t *)_TIFFcallocExt(tif,0x110,1);
    tif->tif_data = puVar2;
    if (puVar2 != (uint8_t *)0x0) {
      puVar2[0xcc] = '\0';
      puVar2[0xcd] = '\0';
      puVar2[0xce] = '\0';
      puVar2[0xcf] = '\0';
      puVar2[0xd0] = '\0';
      puVar2[0xd1] = '\0';
      puVar2[0xd2] = '\0';
      puVar2[0xd3] = '\0';
      puVar2[0xd4] = '\0';
      puVar2[0xd5] = '\0';
      puVar2[0xd6] = '\0';
      puVar2[0xd7] = '\0';
      puVar2[0xd8] = '\0';
      puVar2[0xd9] = '\0';
      puVar2[0xda] = '\0';
      puVar2[0xdb] = '\0';
      puVar2[0xc0] = '\0';
      puVar2[0xc1] = '\0';
      puVar2[0xc2] = '\0';
      puVar2[0xc3] = '\0';
      puVar2[0xc4] = '\0';
      puVar2[0xc5] = '\0';
      puVar2[0xc6] = '\0';
      puVar2[199] = '\0';
      puVar2[200] = '\0';
      puVar2[0xc9] = '\0';
      puVar2[0xca] = '\0';
      puVar2[0xcb] = '\0';
      puVar2[0xcc] = '\0';
      puVar2[0xcd] = '\0';
      puVar2[0xce] = '\0';
      puVar2[0xcf] = '\0';
      *(TIFFVGetMethod *)(puVar2 + 0x100) = (tif->tif_tagmethods).vgetfield;
      (tif->tif_tagmethods).vgetfield = ZIPVGetField;
      *(TIFFVSetMethod *)(puVar2 + 0x108) = (tif->tif_tagmethods).vsetfield;
      (tif->tif_tagmethods).vsetfield = ZIPVSetField;
      puVar2[0xf0] = 0xff;
      puVar2[0xf1] = 0xff;
      puVar2[0xf2] = 0xff;
      puVar2[0xf3] = 0xff;
      puVar2[0xf4] = '\0';
      puVar2[0xf5] = '\0';
      puVar2[0xf6] = '\0';
      puVar2[0xf7] = '\0';
      puVar2[0xf8] = '\0';
      puVar2[0xf9] = '\0';
      puVar2[0xfa] = '\0';
      puVar2[0xfb] = '\0';
      tif->tif_fixuptags = ZIPFixupTags;
      tif->tif_setupdecode = ZIPSetupDecode;
      tif->tif_predecode = ZIPPreDecode;
      tif->tif_decoderow = ZIPDecode;
      tif->tif_decodestrip = ZIPDecode;
      tif->tif_decodetile = ZIPDecode;
      tif->tif_setupencode = ZIPSetupEncode;
      tif->tif_preencode = ZIPPreEncode;
      tif->tif_postencode = ZIPPostEncode;
      tif->tif_encoderow = ZIPEncode;
      tif->tif_encodestrip = ZIPEncode;
      tif->tif_encodetile = ZIPEncode;
      tif->tif_cleanup = ZIPCleanup;
      TIFFPredictorInit(tif);
      return 1;
    }
    fmt = "No space for ZIP state block";
  }
  TIFFErrorExtR(tif,"TIFFInitZIP",fmt);
  return 0;
}

Assistant:

int TIFFInitZIP(TIFF *tif, int scheme)
{
    static const char module[] = "TIFFInitZIP";
    ZIPState *sp;

    assert((scheme == COMPRESSION_DEFLATE) ||
           (scheme == COMPRESSION_ADOBE_DEFLATE));
#ifdef NDEBUG
    (void)scheme;
#endif

    /*
     * Merge codec-specific tag information.
     */
    if (!_TIFFMergeFields(tif, zipFields, TIFFArrayCount(zipFields)))
    {
        TIFFErrorExtR(tif, module,
                      "Merging Deflate codec-specific tags failed");
        return 0;
    }

    /*
     * Allocate state block so tag methods have storage to record values.
     */
    tif->tif_data = (uint8_t *)_TIFFcallocExt(tif, sizeof(ZIPState), 1);
    if (tif->tif_data == NULL)
        goto bad;
    sp = ZState(tif);
    sp->stream.zalloc = NULL;
    sp->stream.zfree = NULL;
    sp->stream.opaque = NULL;
    sp->stream.data_type = Z_BINARY;

    /*
     * Override parent get/set field methods.
     */
    sp->vgetparent = tif->tif_tagmethods.vgetfield;
    tif->tif_tagmethods.vgetfield = ZIPVGetField; /* hook for codec tags */
    sp->vsetparent = tif->tif_tagmethods.vsetfield;
    tif->tif_tagmethods.vsetfield = ZIPVSetField; /* hook for codec tags */

    /* Default values for codec-specific fields */
    sp->zipquality = Z_DEFAULT_COMPRESSION; /* default comp. level */
    sp->state = 0;
#if LIBDEFLATE_SUPPORT
    sp->subcodec = DEFLATE_SUBCODEC_LIBDEFLATE;
#else
    sp->subcodec = DEFLATE_SUBCODEC_ZLIB;
#endif

    /*
     * Install codec methods.
     */
    tif->tif_fixuptags = ZIPFixupTags;
    tif->tif_setupdecode = ZIPSetupDecode;
    tif->tif_predecode = ZIPPreDecode;
    tif->tif_decoderow = ZIPDecode;
    tif->tif_decodestrip = ZIPDecode;
    tif->tif_decodetile = ZIPDecode;
    tif->tif_setupencode = ZIPSetupEncode;
    tif->tif_preencode = ZIPPreEncode;
    tif->tif_postencode = ZIPPostEncode;
    tif->tif_encoderow = ZIPEncode;
    tif->tif_encodestrip = ZIPEncode;
    tif->tif_encodetile = ZIPEncode;
    tif->tif_cleanup = ZIPCleanup;
    /*
     * Setup predictor setup.
     */
    (void)TIFFPredictorInit(tif);
    return (1);
bad:
    TIFFErrorExtR(tif, module, "No space for ZIP state block");
    return (0);
}